

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

sunrealtype N_VMin_SensWrapper(N_Vector x)

{
  long lVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  
  sVar2 = N_VMin((N_Vector)**x->content);
  for (lVar1 = 1; lVar1 < (int)*(long *)((long)x->content + 8); lVar1 = lVar1 + 1) {
    sVar3 = N_VMin(*(N_Vector *)(*x->content + lVar1 * 8));
    if (sVar2 <= sVar3) {
      sVar3 = sVar2;
    }
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

sunrealtype N_VMin_SensWrapper(N_Vector x)
{
  int i;
  sunrealtype min, tmp;

  min = N_VMin(NV_VEC_SW(x, 0));

  for (i = 1; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VMin(NV_VEC_SW(x, i));
    if (tmp < min) { min = tmp; }
  }

  return (min);
}